

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.cpp
# Opt level: O2

bool __thiscall
Ray::cast(Ray *this,Color *c,
         vector<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_> *objects,
         vector<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_> *lights)

{
  __shared_ptr<Light,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  Color c_00;
  int iVar4;
  undefined4 extraout_var;
  Material *this_00;
  __shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  __shared_ptr<Light,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  shared_ptr<Ray> sVar9;
  Color diffuseColor;
  shared_ptr<Obj> e;
  shared_ptr<Light> light;
  Color local_c0;
  undefined4 local_bc;
  __shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2> local_b8;
  Color *local_a8;
  vector<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_> *local_a0;
  vec4 *local_98;
  Ray *local_90;
  __shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2> *local_88;
  __shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2> *local_80;
  __shared_ptr<Light,_(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_68 [16];
  __shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 *puVar5;
  
  local_88 = &((objects->
               super__Vector_base<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_>).
               _M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2>;
  local_98 = &this->direction;
  bVar7 = false;
  local_a8 = c;
  local_a0 = lights;
  local_90 = this;
  for (p_Var6 = &((objects->
                  super__Vector_base<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_>).
                  _M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2>; p_Var6 != local_88;
      p_Var6 = p_Var6 + 1) {
    std::__shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_b8,p_Var6);
    peVar2 = local_b8._M_ptr;
    sVar9 = std::
            make_shared<Ray,glm::tvec4<float,(glm::precision)0>&,glm::tvec4<float,(glm::precision)0>&>
                      ((tvec4<float,_(glm::precision)0> *)local_68,&local_90->start);
    iVar4 = (*peVar2->_vptr_Obj[1])
                      (peVar2,(tvec4<float,_(glm::precision)0> *)local_68,
                       sVar9.super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                       _M_pi);
    puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    if (puVar5 != (undefined8 *)0x0) {
      local_80 = p_Var6;
      this_00 = Obj::getMaterial(local_b8._M_ptr);
      local_c0 = Material::getColor(this_00);
      p_Var1 = &((local_a0->
                 super__Vector_base<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<Light,_(__gnu_cxx::_Lock_policy)2>;
      for (p_Var8 = &((local_a0->
                      super__Vector_base<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<Light,_(__gnu_cxx::_Lock_policy)2>; p_Var8 != p_Var1;
          p_Var8 = p_Var8 + 1) {
        std::__shared_ptr<Light,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_78,p_Var8);
        peVar3 = local_78._M_ptr;
        local_48 = *puVar5;
        uStack_40 = 0;
        local_bc = *(undefined4 *)(puVar5 + 1);
        std::__shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_58,&local_b8);
        iVar4 = (**peVar3->_vptr_Light)((undefined4)local_48,local_bc,peVar3,&local_58);
        c_00 = Color::operator*(&local_c0,SUB43(iVar4,0));
        Color::operator=(&local_c0,c_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
      }
      Color::operator=(local_a8,local_c0);
      bVar7 = true;
      p_Var6 = local_80;
    }
    operator_delete(puVar5);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  }
  return bVar7;
}

Assistant:

bool Ray::cast(Color& c, std::vector<std::shared_ptr<Obj>> objects, std::vector<std::shared_ptr<Light>> lights) {
    bool intersected = false;
    for( auto e : objects) {
        glm::vec3* hitpoint = e->intersect(std::make_shared<Ray>(start, direction));
        if (hitpoint != nullptr) {
            //c = e->getMaterial().getColor();
            Color diffuseColor =  e->getMaterial().getColor();
            for(auto light : lights){
                diffuseColor = diffuseColor * light->diffuse(*hitpoint, e);
            }
            c =  diffuseColor;
            intersected = true;
        }
        delete hitpoint;
    }
    return intersected;
}